

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<void> __thiscall
kj::HttpService::Response::sendError
          (Response *this,uint statusCode,StringPtr statusText,HttpHeaders *headers)

{
  undefined1 *puVar1;
  AsyncOutputStream *pAVar2;
  long *plVar3;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  undefined4 in_register_00000034;
  Promise<void> PVar5;
  Promise<void> promise;
  Own<kj::AsyncOutputStream> stream;
  Own<kj::AsyncOutputStream> local_50;
  undefined8 *local_40;
  long *local_38;
  undefined1 local_30;
  undefined1 *local_28;
  PromiseNode *pPVar4;
  
  puVar1 = (undefined1 *)((long)&headers[-1].ownedStrings.builder.disposer + 7);
  local_30 = 1;
  local_28 = puVar1;
  (*(code *)**(undefined8 **)CONCAT44(in_register_00000034,statusCode))
            (&local_40,(undefined8 *)CONCAT44(in_register_00000034,statusCode),
             statusText.content.ptr);
  (**(code **)*local_38)(&local_50,local_38,statusText.content.size_,puVar1);
  PVar5 = Promise<void>::attach<kj::Own<kj::AsyncOutputStream>>((Promise<void> *)this,&local_50);
  pAVar2 = local_50.ptr;
  pPVar4 = PVar5.super_PromiseBase.node.ptr;
  if (local_50.ptr != (AsyncOutputStream *)0x0) {
    local_50.ptr = (AsyncOutputStream *)0x0;
    (**(local_50.disposer)->_vptr_Disposer)
              (local_50.disposer,
               pAVar2->_vptr_AsyncOutputStream[-2] + (long)&pAVar2->_vptr_AsyncOutputStream);
    pPVar4 = extraout_RDX;
  }
  plVar3 = local_38;
  if (local_38 != (long *)0x0) {
    local_38 = (long *)0x0;
    (**(code **)*local_40)(local_40,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    pPVar4 = extraout_RDX_00;
  }
  PVar5.super_PromiseBase.node.ptr = pPVar4;
  PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar5.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> HttpService::Response::sendError(
    uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers) {
  auto stream = send(statusCode, statusText, headers, statusText.size());
  auto promise = stream->write(statusText.begin(), statusText.size());
  return promise.attach(kj::mv(stream));
}